

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

bool __thiscall
r_exec::IPGMContext::evaluate_no_dereference(IPGMContext *this,uint16_t *result_index)

{
  Atom *pAVar1;
  View *pVVar2;
  byte bVar3;
  bool bVar4;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  Operator *pOVar9;
  uint16_t uVar10;
  bool bVar11;
  uint16_t unused_result_index;
  Context _c;
  uint16_t local_aa;
  uint16_t *local_a8;
  _func_bool_Context_ptr_uint16_t_ptr *local_a0;
  _func_bool_Context_ptr_uint16_t_ptr *local_98;
  IPGMContext local_90;
  IPGMContext local_60;
  
  bVar11 = true;
  switch((this->super__Context).data) {
  case REFERENCE:
  case VALUE_ARRAY:
    break;
  case VIEW:
  case MKS:
  case VWS:
    *result_index = (this->super__Context).index;
    break;
  default:
    local_a8 = result_index;
    bVar3 = r_code::Atom::getDescriptor();
    uVar7 = bVar3 - 0xc1;
    if (uVar7 < 0xe) {
      if ((0x3f8bU >> (uVar7 & 0x1f) & 1) == 0) {
        if (uVar7 != 2) {
          if (uVar7 == 4) {
            uVar5 = r_code::Atom::asOpcode();
            pOVar9 = r_code::vector<r_exec::Operator>::operator[]
                               ((vector<r_exec::Operator> *)Operator::Operators,(ulong)uVar5);
            local_98 = pOVar9->_operator;
            if (local_98 == syn) {
              return true;
            }
            local_a0 = pOVar9->_overload;
            if (local_98 != red) {
              iVar8 = (*(this->super__Context)._vptr__Context[6])(this);
              if ((ushort)iVar8 != 0) {
                uVar10 = 1;
                do {
                  getChild(&local_60,this,uVar10);
                  operator*(&local_90,&local_60);
                  bVar11 = evaluate_no_dereference(&local_90,&local_aa);
                  if (!bVar11) goto switchD_0015d19d_caseD_7;
                  uVar10 = uVar10 + 1;
                } while (uVar10 <= (ushort)iVar8);
              }
            }
            local_90.super__Context.overlay = (Overlay *)operator_new(0x30);
            ((local_90.super__Context.overlay)->super__Object)._vptr__Object =
                 (_func_int **)&PTR___Context_001be470;
            pAVar1 = (this->super__Context).code;
            ((local_90.super__Context.overlay)->super__Object).refCount.super___atomic_base<long>.
            _M_i = (__int_type)(this->super__Context).overlay;
            ((local_90.super__Context.overlay)->invalidated).super___atomic_base<unsigned_long>._M_i
                 = (__int_type_conflict)pAVar1;
            (local_90.super__Context.overlay)->controller =
                 *(Controller **)&(this->super__Context).index;
            ((local_90.super__Context.overlay)->super__Object)._vptr__Object =
                 (_func_int **)&PTR___Context_001be3f0;
            pVVar2 = this->view;
            ((local_90.super__Context.overlay)->values).m_vector.
            super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)this->object;
            ((local_90.super__Context.overlay)->values).m_vector.
            super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)pVVar2;
            local_90.super__Context._vptr__Context = (_func_int **)&PTR__Context_001be4c8;
            bVar11 = (*local_98)((Context *)&local_90,local_a8);
            bVar4 = true;
            if (!bVar11) {
              if (local_a0 == (_func_bool_Context_ptr_uint16_t_ptr *)0x0) {
                bVar4 = false;
              }
              else {
                bVar4 = (*local_a0)((Context *)&local_90,local_a8);
              }
            }
            local_90.super__Context._vptr__Context = (_func_int **)&PTR__Context_001be4c8;
            if (local_90.super__Context.overlay == (Overlay *)0x0) {
              return bVar4;
            }
            (*((local_90.super__Context.overlay)->super__Object)._vptr__Object[1])();
            return bVar4;
          }
          goto LAB_0015d3d9;
        }
        sVar6 = r_code::Atom::asOpcode();
        if ((sVar6 != Opcodes::Ptn) && (sVar6 = r_code::Atom::asOpcode(), sVar6 != Opcodes::AntiPtn)
           ) goto switchD_0015d19d_caseD_7;
      }
      else {
        iVar8 = (*(this->super__Context)._vptr__Context[6])(this);
        uVar5 = (ushort)iVar8;
        bVar11 = uVar5 == 0;
        if (!bVar11) {
          uVar10 = 1;
          do {
            getChild(&local_60,this,uVar10);
            operator*(&local_90,&local_60);
            bVar11 = evaluate_no_dereference(&local_90,&local_aa);
            if (!bVar11) goto switchD_0015d19d_caseD_7;
            uVar10 = uVar10 + 1;
            bVar11 = uVar5 < uVar10;
          } while (uVar10 <= uVar5);
        }
      }
      *local_a8 = (this->super__Context).index;
    }
    else {
LAB_0015d3d9:
      *local_a8 = (this->super__Context).index;
    }
    break;
  case UNDEFINED:
switchD_0015d19d_caseD_7:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool IPGMContext::evaluate_no_dereference(uint16_t &result_index) const
{
    switch (data) {
    case REFERENCE:
    case VALUE_ARRAY:
        return true;

    case UNDEFINED:
        return false;

    case VIEW:
    case MKS:
    case VWS:
        result_index = index;
        return true;
    }

    switch (code[index].getDescriptor()) {
    case Atom::OPERATOR: {
        Operator op = Operator::Get((*this)[0].asOpcode());

        if (op.is_syn()) {
            return true;
        }

        if (!op.is_red()) { // red will prevent the evaluation of its productions before reducting its input.
            uint16_t atom_count = getChildrenCount();

            for (uint16_t i = 1; i <= atom_count; ++i) {
                uint16_t unused_result_index;

                if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                    return false;
                }
            }
        }

        IPGMContext *__c = new IPGMContext(*this);
        Context _c(__c);
        return op(_c, result_index);
    }

    case Atom::OBJECT: // incl. cmd.
        if ((*this)[0].asOpcode() == Opcodes::Ptn || (*this)[0].asOpcode() == Opcodes::AntiPtn) { // skip patterns.
            result_index = index;
            return true;
        }
        return false;

    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
    case Atom::GROUP:
    case Atom::SET:
    case Atom::S_SET: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        result_index = index;
        return true;
    }

    default:
        result_index = index;
        return true;
    }
}